

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O3

void multikey_multipivot<unsigned_int,32u>(uchar **strings,size_t n,size_t depth)

{
  _Rb_tree_header *__position;
  long lVar1;
  uchar *puVar2;
  size_t n_00;
  size_t n_01;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  size_t i_1;
  void *__src;
  uint j;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  uchar **ppuVar16;
  unsigned_long uVar17;
  byte bVar18;
  byte *__ptr;
  int iVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sample_array;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> sample;
  array<unsigned_int,_32UL> pivots;
  array<unsigned_long,_65UL> bucketsize;
  byte local_338;
  byte bStack_334;
  byte bStack_330;
  byte bStack_32c;
  void *local_320;
  long local_318;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_308;
  double local_2d8;
  double dStack_2d0;
  uint local_2c8 [4];
  _Alloc_node local_2b8 [15];
  uint local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  size_t local_40;
  size_t local_38;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  __position = &local_308._M_impl.super__Rb_tree_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar19 = 0;
  local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar12 = n - 7;
  auVar22._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar22._0_8_ = lVar12;
  auVar22._12_4_ = 0x45300000;
  dStack_2d0 = auVar22._8_8_ - 1.9342813113834067e+25;
  local_2d8 = dStack_2d0 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
  local_308._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    dVar21 = drand48();
    uVar11 = (ulong)(dVar21 * local_2d8);
    uVar11 = (long)(dVar21 * local_2d8 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    if (n <= uVar11 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                   );
    }
    lVar12 = 0;
    do {
      puVar2 = strings[uVar11 + lVar12];
      if (puVar2 == (uchar *)0x0) goto LAB_00223a51;
      if (puVar2[depth] == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (uint)puVar2[depth] << 0x18;
        if (puVar2[depth + 1] != 0) {
          uVar14 = uVar14 | (uint)puVar2[depth + 1] << 0x10;
          if (puVar2[depth + 2] != '\0') {
            uVar14 = uVar14 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
          }
        }
      }
      *(uint *)((long)&local_238 + lVar12 * 4) = uVar14;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 7);
    lVar12 = 0;
    local_2b8[0]._M_t = &local_308;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_308,(const_iterator)__position,(uint *)((long)&local_238 + lVar12),
                 local_2b8);
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x1c);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 0x20);
  local_238._0_4_ = 1;
  if (local_308._M_impl.super__Rb_tree_header._M_node_count < 0x20) {
    do {
      if ((char)(uint)local_238 == '\0') {
        local_238._0_4_ = (uint)local_238 | 1;
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_308,(uint *)&local_238);
      local_238._0_4_ = (uint)local_238 + 1;
    } while (local_308._M_impl.super__Rb_tree_header._M_node_count < 0x20);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_320,
             (_Rb_tree_const_iterator<unsigned_int>)
             local_308._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)__position,(allocator_type *)&local_238);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&local_308);
  uVar11 = (ulong)(local_318 - (long)local_320) >> 7;
  if ((int)uVar11 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                 );
  }
  uVar15 = 0;
  lVar12 = 0;
  do {
    *(undefined4 *)((long)&local_2b8[0]._M_t + lVar12 * 4) =
         *(undefined4 *)((long)local_320 + (uVar15 & 0xffffffff) * 4);
    lVar12 = lVar12 + 1;
    uVar15 = uVar15 + uVar11;
  } while (lVar12 != 0x20);
  iVar19 = posix_memalign((void **)&local_238,0x10,n);
  pbVar7 = (byte *)CONCAT44(local_238._4_4_,(uint)local_238);
  lVar12 = 0;
  do {
    uVar14 = *(uint *)((long)&local_2b8[0]._M_t + lVar12);
    lVar1 = lVar12 * 4;
    *(uint *)((long)&local_238 + lVar1) = uVar14 ^ 0x80000000;
    *(uint *)((long)&local_238 + lVar1 + 4) = uVar14 ^ 0x80000000;
    *(uint *)((long)&uStack_230 + lVar1) = uVar14 ^ 0x80000000;
    *(uint *)((long)&uStack_230 + lVar1 + 4) = uVar14 ^ 0x80000000;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x80);
  __ptr = (byte *)0x0;
  if (iVar19 == 0) {
    __ptr = pbVar7;
  }
  uVar11 = n & 0xfffffffffffffff0;
  if (uVar11 != 0) {
    uVar15 = 0;
    ppuVar16 = strings;
    do {
      lVar12 = 0;
      do {
        puVar2 = ppuVar16[lVar12];
        if (puVar2 == (uchar *)0x0) goto LAB_00223a51;
        if (puVar2[depth] == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (uint)puVar2[depth] << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar14 = uVar14 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar14 = uVar14 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        local_2c8[lVar12] = uVar14;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      uVar23 = local_2c8[0] ^ 0x80000000;
      uVar24 = local_2c8[1] ^ 0x80000000;
      uVar25 = local_2c8[2] ^ 0x80000000;
      uVar26 = local_2c8[3] ^ 0x80000000;
      local_338 = 0;
      bStack_334 = 0;
      bStack_330 = 0;
      bStack_32c = 0;
      lVar12 = 0x10;
      uVar14 = (uint)local_238;
      uVar31 = local_238._4_4_;
      uVar32 = (uint)uStack_230;
      uVar33 = uStack_230._4_4_;
      bVar18 = 1;
      bVar8 = 1;
      bVar9 = 1;
      bVar10 = 1;
      do {
        bVar30 = bVar10;
        bVar29 = bVar9;
        bVar28 = bVar8;
        bVar27 = bVar18;
        uVar3 = *(uint *)((long)&local_238 + lVar12);
        uVar4 = *(uint *)((long)&local_238 + lVar12 + 4);
        uVar5 = *(uint *)((long)&uStack_230 + lVar12);
        uVar6 = *(uint *)((long)&uStack_230 + lVar12 + 4);
        local_338 = -((int)uVar23 < (int)uVar3) & -((int)uVar14 < (int)uVar23) & bVar27 + 1 |
                    -(uVar23 == uVar14) & bVar27 | local_338;
        bStack_334 = -((int)uVar24 < (int)uVar4) & -((int)uVar31 < (int)uVar24) & bVar28 + 1 |
                     -(uVar24 == uVar31) & bVar28 | bStack_334;
        bStack_330 = -((int)uVar25 < (int)uVar5) & -((int)uVar32 < (int)uVar25) & bVar29 + 1 |
                     -(uVar25 == uVar32) & bVar29 | bStack_330;
        bStack_32c = -((int)uVar26 < (int)uVar6) & -((int)uVar33 < (int)uVar26) & bVar30 + 1 |
                     -(uVar26 == uVar33) & bVar30 | bStack_32c;
        lVar12 = lVar12 + 0x10;
        uVar14 = uVar3;
        uVar31 = uVar4;
        uVar32 = uVar5;
        uVar33 = uVar6;
        bVar18 = bVar27 + 2;
        bVar8 = bVar28 + 2;
        bVar9 = bVar29 + 2;
        bVar10 = bVar30 + 2;
      } while (lVar12 != 0x200);
      local_338 = local_338 |
                  -((int)uVar3 < (int)uVar23) & bVar27 + 3 | -(uVar23 == uVar3) & bVar27 + 2;
      bStack_334 = bStack_334 |
                   -((int)uVar4 < (int)uVar24) & bVar28 + 3 | -(uVar24 == uVar4) & bVar28 + 2;
      bStack_330 = bStack_330 |
                   -((int)uVar5 < (int)uVar25) & bVar29 + 3 | -(uVar25 == uVar5) & bVar29 + 2;
      bStack_32c = bStack_32c |
                   -((int)uVar6 < (int)uVar26) & bVar30 + 3 | -(uVar26 == uVar6) & bVar30 + 2;
      __ptr[uVar15] = local_338;
      __ptr[uVar15 + 1] = bStack_334;
      __ptr[uVar15 + 2] = bStack_330;
      __ptr[uVar15 + 3] = bStack_32c;
      uVar15 = uVar15 + 4;
      ppuVar16 = ppuVar16 + 4;
    } while (uVar15 < uVar11);
  }
  if (uVar11 != n) {
    do {
      puVar2 = strings[uVar11];
      if (puVar2 == (uchar *)0x0) {
LAB_00223a51:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      bVar18 = puVar2[depth];
      if (bVar18 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (uint)bVar18 << 0x18;
        if (puVar2[depth + 1] != 0) {
          uVar14 = (uint)bVar18 << 0x18 | (uint)puVar2[depth + 1] << 0x10;
          if (puVar2[depth + 2] != '\0') {
            uVar14 = uVar14 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
          }
        }
      }
      if (uVar14 < (uint)local_2b8[0]._M_t) {
        __ptr[uVar11] = 0;
      }
      else {
        lVar12 = 2;
        bVar18 = 1;
        do {
          uVar31 = *(uint *)((long)local_2b8 + lVar12 * 2 + -4);
          if (uVar14 == uVar31) {
            __ptr[uVar11] = bVar18;
            goto LAB_002237be;
          }
          if ((uVar31 < uVar14) && (uVar14 < *(uint *)((long)&local_2b8[0]._M_t + lVar12 * 2))) {
            __ptr[uVar11] = (byte)lVar12;
            goto LAB_002237be;
          }
          lVar12 = lVar12 + 2;
          bVar18 = bVar18 + 2;
        } while (lVar12 != 0x40);
        if (uVar14 == local_23c) {
          __ptr[uVar11] = 0x3f;
        }
        else {
          __ptr[uVar11] = 0x40;
        }
      }
LAB_002237be:
      uVar11 = uVar11 + 1;
    } while (uVar11 < n);
  }
  memset(&local_238,0,0x208);
  bVar18 = *__ptr;
  (&local_238)[bVar18] = (&local_238)[bVar18] + 1;
  if (__ptr[1] < bVar18) {
    uVar11 = 1;
    bVar20 = true;
  }
  else {
    uVar11 = 1;
    bVar18 = __ptr[1];
    do {
      (&local_238)[bVar18] = (&local_238)[bVar18] + 1;
      if ((2 - n) + uVar11 == 1) goto LAB_002238cf;
      lVar12 = uVar11 + 1;
      uVar11 = uVar11 + 1;
      bVar20 = bVar18 <= __ptr[lVar12];
      bVar18 = __ptr[lVar12];
    } while (bVar20);
    bVar20 = uVar11 < n;
  }
  if (uVar11 < n) {
    do {
      (&local_238)[__ptr[uVar11]] = (&local_238)[__ptr[uVar11]] + 1;
      uVar11 = uVar11 + 1;
    } while (n != uVar11);
  }
  if (bVar20) {
    __src = malloc(n * 8);
    multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[0] = 0;
    lVar12 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + (&local_238)[lVar12];
      multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[lVar12 + 1] = uVar17;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    sVar13 = 0;
    do {
      puVar2 = strings[sVar13];
      uVar17 = multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[sVar13]];
      multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[sVar13]] = uVar17 + 1;
      *(uchar **)((long)__src + uVar17 * 8) = puVar2;
      sVar13 = sVar13 + 1;
    } while (n != sVar13);
    memcpy(strings,__src,n * 8);
    free(__src);
  }
LAB_002238cf:
  free(__ptr);
  sVar13 = CONCAT44(local_238._4_4_,(uint)local_238);
  if (sVar13 != 0) {
    multikey_multipivot<unsigned_int,32u>(strings,sVar13,depth);
  }
  lVar12 = 0;
  do {
    n_00 = (&uStack_230)[lVar12 * 2];
    if ((n_00 != 0) && (*(char *)((long)&local_2b8[0]._M_t + lVar12 * 4) != '\0')) {
      multikey_multipivot<unsigned_int,32u>(strings + sVar13,n_00,depth + 4);
    }
    n_01 = (&uStack_220)[lVar12 * 2 + -1];
    if (n_01 != 0) {
      uVar14 = *(uint *)((long)&local_2b8[0]._M_t + lVar12 * 4);
      uVar31 = *(uint *)((long)&local_2b8[0]._M_t + lVar12 * 4 + 4);
      if (uVar14 == uVar31) {
        __assert_fail("a != b",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                      ,0x60,"unsigned int lcp(uint32_t, uint32_t)");
      }
      if ((uVar14 & 0xff000000) == (uVar31 & 0xff000000) && (uVar14 & 0xff000000) != 0) {
        uVar11 = 1;
        if ((uVar14 & 0xff0000) == (uVar31 & 0xff0000) && (uVar14 & 0xff0000) != 0) {
          uVar11 = (ulong)((uVar14 & 0xff00) == (uVar31 & 0xff00) && (uVar14 & 0xff00) != 0) | 2;
        }
      }
      else {
        uVar11 = 0;
      }
      multikey_multipivot<unsigned_int,32u>(strings + n_00 + sVar13,n_01,uVar11 + depth);
    }
    lVar12 = lVar12 + 1;
    sVar13 = n_01 + n_00 + sVar13;
  } while (lVar12 != 0x1f);
  if (local_40 != 0) {
    if ((char)local_23c != '\0') {
      multikey_multipivot<unsigned_int,32u>(strings + sVar13,local_40,depth + 4);
    }
    sVar13 = sVar13 + local_40;
  }
  if (local_38 != 0) {
    multikey_multipivot<unsigned_int,32u>(strings + sVar13,local_38,depth);
  }
  if (local_320 != (void *)0x0) {
    operator_delete(local_320);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_308);
  return;
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}